

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::WeakZeroSourceSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SERecurrentNode *destination,
          SENode *coefficient,DistanceEntry *distance_entry)

{
  ScalarEvolutionAnalysis *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long value;
  int64_t bound_one;
  int64_t bound_two;
  bool bVar3;
  int iVar4;
  int iVar5;
  Loop *loop;
  SENode *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar8;
  SENode *pSVar9;
  SENode *operand_2;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *puVar10;
  long *plVar11;
  size_type *psVar12;
  ulong *puVar13;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  long *local_3b0;
  undefined8 local_3a8;
  long local_3a0;
  undefined8 uStack_398;
  long local_390;
  string local_388;
  DistanceEntry *local_368;
  long *local_360;
  undefined8 local_358;
  long local_350;
  undefined8 uStack_348;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  SENode *local_320;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  string local_2f8;
  string local_2d8;
  ScalarEvolutionAnalysis *local_2b8;
  SERecurrentNode *local_2b0;
  SENode *local_2a8;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> local_40;
  
  local_368 = distance_entry;
  local_2a8 = coefficient;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Performing WeakZeroSourceSIVTest.","");
  PrintDebug(this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_40.first = source;
  local_40.second = &destination->super_SENode;
  loop = GetLoopForSubscriptPair(this,&local_40);
  local_2b0 = destination;
  pSVar6 = GetConstantTerm(this,loop,destination);
  pSVar1 = &this->scalar_evolution_;
  local_320 = source;
  pSVar6 = ScalarEvolutionAnalysis::CreateSubtraction(pSVar1,source,pSVar6);
  local_2b8 = pSVar1;
  pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
  iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
  iVar5 = (*local_2a8->_vptr_SENode[4])();
  if (CONCAT44(extraout_var_00,iVar5) == 0 || CONCAT44(extraout_var,iVar4) == 0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "WeakZeroSourceSIVTest was unable to fold delta and coefficient to constants.","");
    PrintDebug(this,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    lVar14 = 0;
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "WeakZeroSourceSIVTest folding delta and coefficient to constants.","");
    PrintDebug(this,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    lVar14 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x30);
    value = *(long *)(CONCAT44(extraout_var_00,iVar5) + 0x30);
    if (lVar14 % value != 0) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "WeakZeroSourceSIVTest proved independence through distance not being an integer.",
                 "");
      PrintDebug(this,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_368->dependence_information = DIRECTION;
      local_368->direction = NONE;
      return true;
    }
    ToString<long>(&local_2a0,this,lVar14);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x8d3830);
    local_318 = &local_308;
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_308 = *plVar11;
      lStack_300 = plVar8[3];
    }
    else {
      local_308 = *plVar11;
      local_318 = (long *)*plVar8;
    }
    local_310 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_318);
    puVar13 = (ulong *)(plVar8 + 2);
    if ((ulong *)*plVar8 == puVar13) {
      local_330 = *puVar13;
      lStack_328 = plVar8[3];
      local_340 = &local_330;
    }
    else {
      local_330 = *puVar13;
      local_340 = (ulong *)*plVar8;
    }
    local_338 = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ToString<long>(&local_2d8,this,value);
    uVar15 = 0xf;
    if (local_340 != &local_330) {
      uVar15 = local_330;
    }
    local_390 = lVar14 / value;
    if (uVar15 < local_2d8._M_string_length + local_338) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        uVar16 = local_2d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_2d8._M_string_length + local_338) goto LAB_005cd054;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_340);
    }
    else {
LAB_005cd054:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_340,(ulong)local_2d8._M_dataplus._M_p);
    }
    local_360 = &local_350;
    plVar8 = puVar10 + 2;
    if ((long *)*puVar10 == plVar8) {
      local_350 = *plVar8;
      uStack_348 = puVar10[3];
    }
    else {
      local_350 = *plVar8;
      local_360 = (long *)*puVar10;
    }
    local_358 = puVar10[1];
    *puVar10 = plVar8;
    puVar10[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_360);
    paVar2 = &local_388.field_2;
    puVar13 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_388.field_2._M_allocated_capacity = *puVar13;
      local_388.field_2._8_8_ = plVar8[3];
      local_388._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_388.field_2._M_allocated_capacity = *puVar13;
      local_388._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_388._M_string_length = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    ToString<long>(&local_2f8,this,local_390);
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar2) {
      uVar16 = local_388.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_2f8._M_string_length + local_388._M_string_length) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        uVar16 = local_2f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_2f8._M_string_length + local_388._M_string_length)
      goto LAB_005cd40f;
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_388._M_dataplus._M_p);
    }
    else {
LAB_005cd40f:
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_388,(ulong)local_2f8._M_dataplus._M_p);
    }
    local_3b0 = &local_3a0;
    plVar8 = puVar10 + 2;
    if ((long *)*puVar10 == plVar8) {
      local_3a0 = *plVar8;
      uStack_398 = puVar10[3];
    }
    else {
      local_3a0 = *plVar8;
      local_3b0 = (long *)*puVar10;
    }
    local_3a8 = puVar10[1];
    *puVar10 = plVar8;
    puVar10[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_220.field_2._M_allocated_capacity = *psVar12;
      local_220.field_2._8_8_ = plVar8[3];
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    }
    else {
      local_220.field_2._M_allocated_capacity = *psVar12;
      local_220._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_220._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    PrintDebug(this,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if (local_3b0 != &local_3a0) {
      operator_delete(local_3b0,local_3a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != paVar2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    lVar14 = local_390;
    if (local_360 != &local_350) {
      operator_delete(local_360,local_350 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_340 != &local_330) {
      operator_delete(local_340,local_330 + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
  }
  pSVar6 = GetLowerBound(this,loop);
  iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
  pSVar6 = GetUpperBound(this,loop);
  iVar5 = (*pSVar6->_vptr_SENode[4])(pSVar6);
  if (CONCAT44(extraout_var_02,iVar5) == 0 || CONCAT44(extraout_var_01,iVar4) == 0) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,
               "WeakZeroSourceSIVTest was unable to find lower and upper bound as SEConstantNodes.",
               "");
    PrintDebug(this,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
LAB_005ccac3:
    pSVar6 = GetFirstTripInductionNode(this,loop);
    pSVar7 = GetConstantTerm(this,loop,local_2b0);
    pSVar1 = local_2b8;
    pSVar6 = ScalarEvolutionAnalysis::CreateAddNode(local_2b8,pSVar6,pSVar7);
    pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
    if (pSVar6 == (SENode *)0x0) {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"WeakZeroSourceSIVTest was unable to build first_trip_SENode",
                 "");
      PrintDebug(this,&local_180);
      pSVar7 = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"WeakZeroSourceSIVTest built first_trip_SENode.","");
      PrintDebug(this,&local_140);
      pSVar7 = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
      if (CONCAT44(extraout_var_03,iVar4) != 0) {
        iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
        ToString<long>(&local_388,this,*(long *)(CONCAT44(extraout_var_04,iVar4) + 0x30));
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x8d3a45);
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_3a0 = *plVar8;
          uStack_398 = puVar10[3];
          local_3b0 = &local_3a0;
        }
        else {
          local_3a0 = *plVar8;
          local_3b0 = (long *)*puVar10;
        }
        local_3a8 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_260.field_2._M_allocated_capacity = *psVar12;
          local_260.field_2._8_8_ = plVar8[3];
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        }
        else {
          local_260.field_2._M_allocated_capacity = *psVar12;
          local_260._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_260._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        PrintDebug(this,&local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        pSVar7 = local_320;
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
      }
      if (pSVar6 == pSVar7) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,
                   "WeakZeroSourceSIVTest has found peeling first iteration will break dependency",
                   "");
        PrintDebug(this,&local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        local_368->dependence_information = PEEL;
        local_368->peel_first = true;
        return false;
      }
    }
    pSVar9 = GetFinalTripInductionNode(this,loop,local_2a8);
    operand_2 = GetConstantTerm(this,loop,local_2b0);
    pSVar1 = local_2b8;
    pSVar9 = ScalarEvolutionAnalysis::CreateAddNode(local_2b8,pSVar9,operand_2);
    pSVar9 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar9);
    if (pSVar9 == (SENode *)0x0) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"WeakZeroSourceSIVTest was unable to build final_trip_SENode",
                 "");
      PrintDebug(this,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"WeakZeroSourceSIVTest built final_trip_SENode.","");
      PrintDebug(this,&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (*pSVar6->_vptr_SENode[4])(pSVar6);
      if (CONCAT44(extraout_var_05,iVar4) != 0) {
        iVar4 = (*pSVar9->_vptr_SENode[4])(pSVar9);
        ToString<long>(&local_388,this,*(long *)(CONCAT44(extraout_var_06,iVar4) + 0x30));
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x8d3b52);
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_3a0 = *plVar8;
          uStack_398 = puVar10[3];
          local_3b0 = &local_3a0;
        }
        else {
          local_3a0 = *plVar8;
          local_3b0 = (long *)*puVar10;
        }
        local_3a8 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
        psVar12 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_280.field_2._M_allocated_capacity = *psVar12;
          local_280.field_2._8_8_ = plVar8[3];
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar12;
          local_280._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_280._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        PrintDebug(this,&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0,local_3a0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
      }
      if (pSVar9 == pSVar7) {
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,
                   "WeakZeroSourceSIVTest has found peeling final iteration will break dependency",
                   "");
        PrintDebug(this,&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        local_368->dependence_information = PEEL;
        local_368->peel_last = true;
        return false;
      }
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,
               "WeakZeroSourceSIVTest was unable to determine any dependence information.","");
    PrintDebug(this,&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    local_368->direction = ALL;
    return false;
  }
  local_390 = lVar14;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"WeakZeroSourceSIVTest found bounds as SEConstantNodes.","");
  PrintDebug(this,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  bound_one = *(int64_t *)(CONCAT44(extraout_var_01,iVar4) + 0x30);
  bound_two = *(int64_t *)(CONCAT44(extraout_var_02,iVar5) + 0x30);
  lVar14 = -local_390;
  if (0 < local_390) {
    lVar14 = local_390;
  }
  bVar3 = IsWithinBounds(this,lVar14,bound_one,bound_two);
  if (bVar3) goto LAB_005ccac3;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,
             "WeakZeroSourceSIVTest proved independence through distance escaping the loop bounds.",
             "");
  PrintDebug(this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  ToString<long>(&local_2a0,this,bound_one);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x8d3969);
  local_318 = &local_308;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_308 = *plVar11;
    lStack_300 = plVar8[3];
  }
  else {
    local_308 = *plVar11;
    local_318 = (long *)*plVar8;
  }
  local_310 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_330 = *puVar13;
    lStack_328 = plVar8[3];
    local_340 = &local_330;
  }
  else {
    local_330 = *puVar13;
    local_340 = (ulong *)*plVar8;
  }
  local_338 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ToString<long>(&local_2d8,this,bound_two);
  uVar15 = 0xf;
  if (local_340 != &local_330) {
    uVar15 = local_330;
  }
  if (uVar15 < local_2d8._M_string_length + local_338) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar16 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_2d8._M_string_length + local_338) goto LAB_005cd14e;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_005cd14e:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_2d8._M_dataplus._M_p);
  }
  local_360 = &local_350;
  plVar8 = puVar10 + 2;
  if ((long *)*puVar10 == plVar8) {
    local_350 = *plVar8;
    uStack_348 = puVar10[3];
  }
  else {
    local_350 = *plVar8;
    local_360 = (long *)*puVar10;
  }
  local_358 = puVar10[1];
  *puVar10 = plVar8;
  puVar10[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_360);
  paVar2 = &local_388.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_388.field_2._M_allocated_capacity = *puVar13;
    local_388.field_2._8_8_ = plVar8[3];
    local_388._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_388.field_2._M_allocated_capacity = *puVar13;
    local_388._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_388._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ToString<long>(&local_2f8,this,local_390);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    uVar16 = local_388.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_2f8._M_string_length + local_388._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      uVar16 = local_2f8.field_2._M_allocated_capacity;
    }
    if (local_2f8._M_string_length + local_388._M_string_length <= (ulong)uVar16) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_388._M_dataplus._M_p);
      goto LAB_005cd72b;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2f8._M_dataplus._M_p);
LAB_005cd72b:
  local_3b0 = &local_3a0;
  plVar8 = puVar10 + 2;
  if ((long *)*puVar10 == plVar8) {
    local_3a0 = *plVar8;
    uStack_398 = puVar10[3];
  }
  else {
    local_3a0 = *plVar8;
    local_3b0 = (long *)*puVar10;
  }
  local_3a8 = puVar10[1];
  *puVar10 = plVar8;
  puVar10[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3b0);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_240.field_2._M_allocated_capacity = *psVar12;
    local_240.field_2._8_8_ = plVar8[3];
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  }
  else {
    local_240.field_2._M_allocated_capacity = *psVar12;
    local_240._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_240._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  PrintDebug(this,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  lVar14 = local_390;
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,local_350 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_368->dependence_information = DISTANCE;
  local_368->direction = NONE;
  local_368->distance = lVar14;
  return true;
}

Assistant:

bool LoopDependenceAnalysis::WeakZeroSourceSIVTest(
    SENode* source, SERecurrentNode* destination, SENode* coefficient,
    DistanceEntry* distance_entry) {
  PrintDebug("Performing WeakZeroSourceSIVTest.");
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  // Build an SENode for distance.
  SENode* destination_constant_term =
      GetConstantTerm(subscript_loop, destination);
  SENode* delta = scalar_evolution_.SimplifyExpression(
      scalar_evolution_.CreateSubtraction(source, destination_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  int64_t distance = 0;
  SEConstantNode* delta_constant = delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    PrintDebug(
        "WeakZeroSourceSIVTest folding delta and coefficient to constants.");
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    // Check if the distance is not integral.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "WeakZeroSourceSIVTest proved independence through distance not "
          "being an integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug(
          "WeakZeroSourceSIVTest calculated distance with the following "
          "values\n"
          "\tdelta value: " +
          ToString(delta_value) +
          "\n\tcoefficient value: " + ToString(coefficient_value) +
          "\n\tdistance: " + ToString(distance) + "\n");
    }
  } else {
    PrintDebug(
        "WeakZeroSourceSIVTest was unable to fold delta and coefficient to "
        "constants.");
  }

  // If we can prove the distance is outside the bounds we prove independence.
  SEConstantNode* lower_bound =
      GetLowerBound(subscript_loop)->AsSEConstantNode();
  SEConstantNode* upper_bound =
      GetUpperBound(subscript_loop)->AsSEConstantNode();
  if (lower_bound && upper_bound) {
    PrintDebug("WeakZeroSourceSIVTest found bounds as SEConstantNodes.");
    int64_t lower_bound_value = lower_bound->FoldToSingleValue();
    int64_t upper_bound_value = upper_bound->FoldToSingleValue();
    if (!IsWithinBounds(llabs(distance), lower_bound_value,
                        upper_bound_value)) {
      PrintDebug(
          "WeakZeroSourceSIVTest proved independence through distance escaping "
          "the loop bounds.");
      PrintDebug(
          "Bound values were as follow\n"
          "\tlower bound value: " +
          ToString(lower_bound_value) +
          "\n\tupper bound value: " + ToString(upper_bound_value) +
          "\n\tdistance value: " + ToString(distance) + "\n");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DISTANCE;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      distance_entry->distance = distance;
      return true;
    }
  } else {
    PrintDebug(
        "WeakZeroSourceSIVTest was unable to find lower and upper bound as "
        "SEConstantNodes.");
  }

  // Now we want to see if we can detect to peel the first or last iterations.

  // We get the FirstTripValue as GetFirstTripInductionNode() +
  // GetConstantTerm(destination)
  SENode* first_trip_SENode =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
          GetFirstTripInductionNode(subscript_loop),
          GetConstantTerm(subscript_loop, destination)));

  // If source == FirstTripValue, peel_first.
  if (first_trip_SENode) {
    PrintDebug("WeakZeroSourceSIVTest built first_trip_SENode.");
    if (first_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroSourceSIVTest has found first_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(first_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (source == first_trip_SENode) {
      // We have found that peeling the first iteration will break dependency.
      PrintDebug(
          "WeakZeroSourceSIVTest has found peeling first iteration will break "
          "dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_first = true;
      return false;
    }
  } else {
    PrintDebug("WeakZeroSourceSIVTest was unable to build first_trip_SENode");
  }

  // We get the LastTripValue as GetFinalTripInductionNode(coefficient) +
  // GetConstantTerm(destination)
  SENode* final_trip_SENode =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
          GetFinalTripInductionNode(subscript_loop, coefficient),
          GetConstantTerm(subscript_loop, destination)));

  // If source == LastTripValue, peel_last.
  if (final_trip_SENode) {
    PrintDebug("WeakZeroSourceSIVTest built final_trip_SENode.");
    if (first_trip_SENode->AsSEConstantNode()) {
      PrintDebug(
          "WeakZeroSourceSIVTest has found final_trip_SENode as an "
          "SEConstantNode with value: " +
          ToString(final_trip_SENode->AsSEConstantNode()->FoldToSingleValue()) +
          "\n");
    }
    if (source == final_trip_SENode) {
      // We have found that peeling the last iteration will break dependency.
      PrintDebug(
          "WeakZeroSourceSIVTest has found peeling final iteration will break "
          "dependency");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::PEEL;
      distance_entry->peel_last = true;
      return false;
    }
  } else {
    PrintDebug("WeakZeroSourceSIVTest was unable to build final_trip_SENode");
  }

  // We were unable to prove independence or discern any additional information.
  // Must assume <=> direction.
  PrintDebug(
      "WeakZeroSourceSIVTest was unable to determine any dependence "
      "information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}